

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColPivHouseholderQR.h
# Opt level: O2

void __thiscall
Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::computeInPlace
          (ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this)

{
  long cCols;
  Index k;
  long lVar1;
  long n;
  long lVar2;
  PermIndexType k_1;
  bool bVar3;
  RealScalar RVar4;
  Scalar SVar5;
  double dVar6;
  Scalar elements [2];
  double dVar7;
  double dVar8;
  Index biggest_col_index;
  long local_148;
  long local_140;
  long local_138;
  double local_130;
  HCoeffsType *local_128;
  DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *local_120;
  RowVectorType *local_118;
  double *local_110;
  long local_108;
  RealScalar beta;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> local_f8 [56];
  Type local_c0;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> local_60 [48];
  
  local_118 = &this->m_temp;
  local_120 = (DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&this->m_colNormsUpdated;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>::Block
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_c0,&this->m_qr,
               lVar1);
    RVar4 = MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
                      ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                        *)&local_c0);
    (this->m_colNormsDirect).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
    m_data.array[lVar1] = RVar4;
    (this->m_colNormsUpdated).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
    .m_data.array[lVar1] = RVar4;
  }
  dVar6 = (this->m_colNormsUpdated).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
          m_storage.m_data.array[0];
  dVar7 = (this->m_colNormsUpdated).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
          m_storage.m_data.array[1];
  if (dVar7 <= dVar6) {
    dVar7 = dVar6;
  }
  dVar6 = (this->m_colNormsUpdated).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
          m_storage.m_data.array[2];
  if (dVar6 <= dVar7) {
    dVar6 = dVar7;
  }
  local_130 = (dVar6 * 2.220446049250313e-16 * dVar6 * 2.220446049250313e-16) / 3.0;
  this->m_nonzero_pivots = 3;
  this->m_maxpivot = 0.0;
  local_128 = &this->m_hCoeffs;
  lVar1 = 0x15;
  local_140 = 3;
  local_148 = 0;
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 3) break;
    n = 3 - lVar2;
    local_138 = lVar1;
    DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::tail<long>((Type *)&local_c0,local_120,n);
    SVar5 = DenseBase<Eigen::Block<Eigen::Matrix<double,1,3,1,1,3>,1,-1,false>>::maxCoeff<0,long>
                      ((DenseBase<Eigen::Block<Eigen::Matrix<double,1,3,1,1,3>,1,_1,false>> *)
                       &local_c0,&biggest_col_index);
    lVar1 = biggest_col_index + lVar2;
    if ((this->m_nonzero_pivots == 3) && (SVar5 * SVar5 < (double)(int)n * local_130)) {
      this->m_nonzero_pivots = lVar2;
    }
    (this->m_colsTranspositions).super_PlainObjectBase<Eigen::Matrix<long,_1,_3,_1,_1,_3>_>.
    m_storage.m_data.array[lVar2] = lVar1;
    bVar3 = biggest_col_index != 0;
    biggest_col_index = lVar1;
    if (bVar3) {
      Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>::Block
                ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)&local_c0,&this->m_qr,
                 lVar2);
      Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>::Block
                ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)local_f8,&this->m_qr,
                 biggest_col_index);
      DenseBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::
      swap<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
                ((DenseBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>> *)&local_c0,
                 local_f8);
      dVar6 = (this->m_colNormsUpdated).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
              .m_storage.m_data.array[lVar2];
      (this->m_colNormsUpdated).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[lVar2] =
           (this->m_colNormsUpdated).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
           m_storage.m_data.array[biggest_col_index];
      (this->m_colNormsUpdated).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[biggest_col_index] = dVar6;
      dVar6 = (this->m_colNormsDirect).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
              m_storage.m_data.array[lVar2];
      (this->m_colNormsDirect).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[lVar2] =
           (this->m_colNormsDirect).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
           m_storage.m_data.array[biggest_col_index];
      (this->m_colNormsDirect).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[biggest_col_index] = dVar6;
      local_148 = local_148 + 1;
    }
    Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>::Block
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)local_f8,&this->m_qr,lVar2
              );
    DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::tail<long>
              (&local_c0,local_f8,n);
    local_110 = (local_128->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array + lVar2;
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_-1,_1,_false>_>
    ::makeHouseholderInPlace
              ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>
                *)&local_c0,local_110,&beta);
    (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [lVar2 * 4] = beta;
    dVar6 = ABS(beta);
    if (this->m_maxpivot <= dVar6 && dVar6 != this->m_maxpivot) {
      this->m_maxpivot = dVar6;
    }
    cCols = 2 - lVar2;
    DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::bottomRightCorner<long,long>
              ((Type *)local_f8,this,n,cCols);
    Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>::Block
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)local_60,&this->m_qr,lVar2
              );
    DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::tail<long>
              (&local_c0,local_60,cCols);
    local_108 = lVar2 + 1;
    MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>>::
    applyHouseholderOnTheLeft<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1>>
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>> *)local_f8,
               &local_c0,local_110,
               (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
               m_data.array + lVar2 + 1);
    lVar2 = local_140;
    for (lVar1 = local_138; lVar1 - 0x14U < 3; lVar1 = lVar1 + 1) {
      dVar6 = (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[lVar1];
      if ((dVar6 != 0.0) || (NAN(dVar6))) {
        dVar7 = ABS((this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[lVar2]) / dVar6;
        dVar8 = (dVar7 + 1.0) * (1.0 - dVar7);
        dVar7 = 0.0;
        if (0.0 <= dVar8) {
          dVar7 = dVar8;
        }
        dVar8 = dVar6 / (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[lVar1 + 3];
        if (dVar8 * dVar8 * dVar7 <= 1.4901161193847656e-08) {
          Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>::Block
                    ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> *)local_f8,&this->m_qr
                     ,lVar1 - 0x14U);
          DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::tail<long>
                    (&local_c0,local_f8,cCols);
          dVar6 = MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_-1,_1,_false>_>
                  ::norm((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>
                          *)&local_c0);
          (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
          .array[lVar1 + 3] = dVar6;
        }
        else {
          dVar6 = dVar6 * SQRT(dVar7);
        }
        (this->m_qr).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[lVar1] = dVar6;
      }
      lVar2 = lVar2 + 3;
    }
    lVar1 = local_138 + 1;
    local_140 = local_140 + 4;
    lVar2 = local_108;
  }
  PermutationBase<Eigen::PermutationMatrix<3,_3,_int>_>::setIdentity
            ((PermutationBase<Eigen::PermutationMatrix<3,_3,_int>_> *)&this->m_colsPermutation,3);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    PermutationBase<Eigen::PermutationMatrix<3,_3,_int>_>::applyTranspositionOnTheRight
              ((PermutationBase<Eigen::PermutationMatrix<3,_3,_int>_> *)&this->m_colsPermutation,
               lVar1,(long)(int)(this->m_colsTranspositions).
                                super_PlainObjectBase<Eigen::Matrix<long,_1,_3,_1,_1,_3>_>.m_storage
                                .m_data.array[lVar1]);
  }
  this->m_det_pq = -(ulong)((uint)local_148 & 1) | 1;
  this->m_isInitialized = true;
  return;
}

Assistant:

void ColPivHouseholderQR<MatrixType>::computeInPlace()
{
  check_template_parameters();

  // the column permutation is stored as int indices, so just to be sure:
  eigen_assert(m_qr.cols()<=NumTraits<int>::highest());

  using std::abs;

  Index rows = m_qr.rows();
  Index cols = m_qr.cols();
  Index size = m_qr.diagonalSize();

  m_hCoeffs.resize(size);

  m_temp.resize(cols);

  m_colsTranspositions.resize(m_qr.cols());
  Index number_of_transpositions = 0;

  m_colNormsUpdated.resize(cols);
  m_colNormsDirect.resize(cols);
  for (Index k = 0; k < cols; ++k) {
    // colNormsDirect(k) caches the most recent directly computed norm of
    // column k.
    m_colNormsDirect.coeffRef(k) = m_qr.col(k).norm();
    m_colNormsUpdated.coeffRef(k) = m_colNormsDirect.coeffRef(k);
  }

  RealScalar threshold_helper =  numext::abs2<RealScalar>(m_colNormsUpdated.maxCoeff() * NumTraits<RealScalar>::epsilon()) / RealScalar(rows);
  RealScalar norm_downdate_threshold = numext::sqrt(NumTraits<RealScalar>::epsilon());

  m_nonzero_pivots = size; // the generic case is that in which all pivots are nonzero (invertible case)
  m_maxpivot = RealScalar(0);

  for(Index k = 0; k < size; ++k)
  {
    // first, we look up in our table m_colNormsUpdated which column has the biggest norm
    Index biggest_col_index;
    RealScalar biggest_col_sq_norm = numext::abs2(m_colNormsUpdated.tail(cols-k).maxCoeff(&biggest_col_index));
    biggest_col_index += k;

    // Track the number of meaningful pivots but do not stop the decomposition to make
    // sure that the initial matrix is properly reproduced. See bug 941.
    if(m_nonzero_pivots==size && biggest_col_sq_norm < threshold_helper * RealScalar(rows-k))
      m_nonzero_pivots = k;

    // apply the transposition to the columns
    m_colsTranspositions.coeffRef(k) = biggest_col_index;
    if(k != biggest_col_index) {
      m_qr.col(k).swap(m_qr.col(biggest_col_index));
      std::swap(m_colNormsUpdated.coeffRef(k), m_colNormsUpdated.coeffRef(biggest_col_index));
      std::swap(m_colNormsDirect.coeffRef(k), m_colNormsDirect.coeffRef(biggest_col_index));
      ++number_of_transpositions;
    }

    // generate the householder vector, store it below the diagonal
    RealScalar beta;
    m_qr.col(k).tail(rows-k).makeHouseholderInPlace(m_hCoeffs.coeffRef(k), beta);

    // apply the householder transformation to the diagonal coefficient
    m_qr.coeffRef(k,k) = beta;

    // remember the maximum absolute value of diagonal coefficients
    if(abs(beta) > m_maxpivot) m_maxpivot = abs(beta);

    // apply the householder transformation
    m_qr.bottomRightCorner(rows-k, cols-k-1)
        .applyHouseholderOnTheLeft(m_qr.col(k).tail(rows-k-1), m_hCoeffs.coeffRef(k), &m_temp.coeffRef(k+1));

    // update our table of norms of the columns
    for (Index j = k + 1; j < cols; ++j) {
      // The following implements the stable norm downgrade step discussed in
      // http://www.netlib.org/lapack/lawnspdf/lawn176.pdf
      // and used in LAPACK routines xGEQPF and xGEQP3.
      // See lines 278-297 in http://www.netlib.org/lapack/explore-html/dc/df4/sgeqpf_8f_source.html
      if (m_colNormsUpdated.coeffRef(j) != RealScalar(0)) {
        RealScalar temp = abs(m_qr.coeffRef(k, j)) / m_colNormsUpdated.coeffRef(j);
        temp = (RealScalar(1) + temp) * (RealScalar(1) - temp);
        temp = temp <  RealScalar(0) ? RealScalar(0) : temp;
        RealScalar temp2 = temp * numext::abs2<RealScalar>(m_colNormsUpdated.coeffRef(j) /
                                                           m_colNormsDirect.coeffRef(j));
        if (temp2 <= norm_downdate_threshold) {
          // The updated norm has become too inaccurate so re-compute the column
          // norm directly.
          m_colNormsDirect.coeffRef(j) = m_qr.col(j).tail(rows - k - 1).norm();
          m_colNormsUpdated.coeffRef(j) = m_colNormsDirect.coeffRef(j);
        } else {
          m_colNormsUpdated.coeffRef(j) *= numext::sqrt(temp);
        }
      }
    }
  }

  m_colsPermutation.setIdentity(PermIndexType(cols));
  for(PermIndexType k = 0; k < size/*m_nonzero_pivots*/; ++k)
    m_colsPermutation.applyTranspositionOnTheRight(k, PermIndexType(m_colsTranspositions.coeff(k)));

  m_det_pq = (number_of_transpositions%2) ? -1 : 1;
  m_isInitialized = true;
}